

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_auth_act(connectdata *conn)

{
  SessionHandle *data_00;
  int iVar1;
  char *pcVar2;
  CURLcode local_28;
  _Bool local_22;
  _Bool local_21;
  CURLcode code;
  _Bool pickproxy;
  _Bool pickhost;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  local_21 = false;
  local_22 = false;
  local_28 = CURLE_OK;
  if (((data_00->req).httpcode < 100) || (199 < (data_00->req).httpcode)) {
    if (((data_00->state).authproblem & 1U) == 0) {
      if ((((conn->bits).user_passwd & 1U) != 0) &&
         ((((data_00->req).httpcode == 0x191 ||
           ((((conn->bits).authneg & 1U) != 0 && ((data_00->req).httpcode < 300)))) &&
          (local_21 = pickoneauth(&(data_00->state).authhost), !local_21)))) {
        (data_00->state).authproblem = true;
      }
      if (((((conn->bits).proxy_user_passwd & 1U) != 0) &&
          (((data_00->req).httpcode == 0x197 ||
           ((((conn->bits).authneg & 1U) != 0 && ((data_00->req).httpcode < 300)))))) &&
         (local_22 = pickoneauth(&(data_00->state).authproxy), !local_22)) {
        (data_00->state).authproblem = true;
      }
      if ((local_21 == false) && (local_22 == false)) {
        if ((((data_00->req).httpcode < 300) && (((data_00->state).authhost.done & 1U) == 0)) &&
           ((((conn->bits).authneg & 1U) != 0 &&
            (((data_00->set).httpreq != HTTPREQ_GET && ((data_00->set).httpreq != HTTPREQ_HEAD))))))
        {
          pcVar2 = (*Curl_cstrdup)((data_00->change).url);
          (data_00->req).newurl = pcVar2;
          if ((data_00->req).newurl == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          (data_00->state).authhost.done = true;
        }
      }
      else {
        if ((data_00->req).newurl != (char *)0x0) {
          (*Curl_cfree)((data_00->req).newurl);
          (data_00->req).newurl = (char *)0x0;
        }
        pcVar2 = (*Curl_cstrdup)((data_00->change).url);
        (data_00->req).newurl = pcVar2;
        if ((data_00->req).newurl == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (((((data_00->set).httpreq != HTTPREQ_GET) && ((data_00->set).httpreq != HTTPREQ_HEAD))
            && (((conn->bits).rewindaftersend & 1U) == 0)) &&
           (local_28 = http_perhapsrewind(conn), local_28 != CURLE_OK)) {
          return local_28;
        }
      }
      iVar1 = http_should_fail(conn);
      if (iVar1 != 0) {
        Curl_failf(data_00,"The requested URL returned error: %d",
                   (ulong)(uint)(data_00->req).httpcode);
        local_28 = CURLE_HTTP_RETURNED_ERROR;
      }
      conn_local._4_4_ = local_28;
    }
    else {
      conn_local._4_4_ = CURLE_OK;
      if (((data_00->set).http_fail_on_error & 1U) != 0) {
        conn_local._4_4_ = CURLE_HTTP_RETURNED_ERROR;
      }
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode code = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      code = http_perhapsrewind(conn);
      if(code)
        return code;
    }
  }

  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf (data, "The requested URL returned error: %d",
           data->req.httpcode);
    code = CURLE_HTTP_RETURNED_ERROR;
  }

  return code;
}